

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

void asm_snap_alloc1(ASMState *as,IRRef ref)

{
  long lVar1;
  IRIns *pIVar2;
  byte bVar3;
  Reg RVar4;
  long lVar5;
  uint uVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  uint uVar9;
  IRIns *ir;
  
  do {
    if (ref < 0x8000) {
      return;
    }
    ir = as->ir + ref;
    if ((ir->field_1).r == 0xfd) {
      return;
    }
    as->snapfilt1 = as->snapfilt1 | 1L << ((byte)ref & 0x3f);
    uVar6 = ref + 0xfb3ee249;
    uVar9 = (uVar6 ^ ref) - (uVar6 * 0x4000 | uVar6 >> 0x12);
    as->snapfilt2 =
         as->snapfilt2 | 1L << (((byte)(uVar6 >> 0xd) ^ (byte)uVar9) - (char)(uVar9 >> 0x13) & 0x3f)
    ;
    if (-1 < (char)(ir->field_1).r) {
      return;
    }
    if ((ir->field_1).s != '\0') {
      return;
    }
    if ((ir->field_1).r == 0xfe) {
      (ir->field_1).r = 0xfd;
      if ((ir->field_1).o != 'T') {
        pIVar7 = as->ir + (as->snapref - 1);
        break;
      }
      ir = (IRIns *)&(ir->field_0).op2;
    }
    else {
      if (((ir->field_1).o != '[') || ((ir->field_0).op2 != 0x1d3)) {
LAB_0013f4e8:
        bVar3 = ((ir->field_1).t.irt & 0x1f) - 0xd;
        uVar6 = 0xbfef;
        if (bVar3 < 2) {
          uVar6 = 0xffff0000;
        }
        if ((as->freeset & uVar6) != 0) goto LAB_0013f507;
        if (bVar3 < 2) {
          lVar5 = 0;
          while (lVar5 != 0x10) {
            lVar1 = lVar5 * 4;
            lVar5 = lVar5 + 1;
            if ((*(byte *)((long)as->cost + lVar1 + 0x41) & 0x80) == 0) {
LAB_0013f507:
              RVar4 = ra_allocref(as,ref,uVar6);
              if (((ir->field_1).t.irt & 0x40) == 0) {
                as->weakset = as->weakset | 1 << ((byte)RVar4 & 0x1f);
              }
              if (as->mclim <= as->mcp) {
                return;
              }
              asm_mclimit(as);
            }
          }
        }
        ra_spill(as,ir);
        return;
      }
      for (pIVar7 = as->ir + as->curins; ir < pIVar7; pIVar7 = pIVar7 + -1) {
        if (((ref == (pIVar7->field_0).op1) || (ref == (pIVar7->field_0).op2)) &&
           (1 < (byte)((pIVar7->field_1).r + 3))) goto LAB_0013f4e8;
      }
    }
    ref = (IRRef)(ir->field_0).op1;
  } while( true );
LAB_0013f57b:
  if (pIVar7 <= ir) {
    return;
  }
  if ((pIVar7->field_1).r == 0xfe) {
    if ((ulong)(pIVar7->field_1).s == 0xff) {
      uVar6 = (pIVar7->field_1).o - 0x4a;
      if ((uVar6 < 5) && (uVar6 != 2)) {
        pIVar2 = as->ir;
        pIVar8 = pIVar2 + (pIVar7->field_0).op1;
        if (((pIVar8->field_1).o & 0xfe) == 0x38) {
          pIVar8 = pIVar2 + (pIVar8->field_0).op1;
        }
        if (pIVar2 + (pIVar8->field_0).op1 == ir) goto LAB_0013f5de;
      }
    }
    else if (pIVar7 == ir + (pIVar7->field_1).s) {
LAB_0013f5de:
      asm_snap_alloc1(as,(uint)(pIVar7->field_0).op2);
    }
  }
  pIVar7 = pIVar7 + -1;
  goto LAB_0013f57b;
}

Assistant:

static void asm_snap_alloc1(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (!irref_isk(ref) && ir->r != RID_SUNK) {
    bloomset(as->snapfilt1, ref);
    bloomset(as->snapfilt2, hashrot(ref, ref + HASH_BIAS));
    if (ra_used(ir)) return;
    if (ir->r == RID_SINK) {
      ir->r = RID_SUNK;
#if LJ_HASFFI
      if (ir->o == IR_CNEWI) {  /* Allocate CNEWI value. */
	asm_snap_alloc1(as, ir->op2);
	if (LJ_32 && (ir+1)->o == IR_HIOP)
	  asm_snap_alloc1(as, (ir+1)->op2);
      } else
#endif
      {  /* Allocate stored values for TNEW, TDUP and CNEW. */
	IRIns *irs;
	lj_assertA(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW,
		   "sink of IR %04d has bad op %d", ref - REF_BIAS, ir->o);
	for (irs = IR(as->snapref-1); irs > ir; irs--)
	  if (irs->r == RID_SINK && asm_sunk_store(as, ir, irs)) {
	    lj_assertA(irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
		       irs->o == IR_FSTORE || irs->o == IR_XSTORE,
		       "sunk store IR %04d has bad op %d",
		       (int)(irs - as->ir) - REF_BIAS, irs->o);
	    asm_snap_alloc1(as, irs->op2);
	    if (LJ_32 && (irs+1)->o == IR_HIOP)
	      asm_snap_alloc1(as, (irs+1)->op2);
	  }
      }
    } else {
      RegSet allow;
      if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT) {
	IRIns *irc;
	for (irc = IR(as->curins); irc > ir; irc--)
	  if ((irc->op1 == ref || irc->op2 == ref) &&
	      !(irc->r == RID_SINK || irc->r == RID_SUNK))
	    goto nosink;  /* Don't sink conversion if result is used. */
	asm_snap_alloc1(as, ir->op1);
	return;
      }
    nosink:
      allow = (!LJ_SOFTFP && irt_isfp(ir->t)) ? RSET_FPR : RSET_GPR;
      if ((as->freeset & allow) ||
	       (allow == RSET_FPR && asm_snap_canremat(as))) {
	/* Get a weak register if we have a free one or can rematerialize. */
	Reg r = ra_allocref(as, ref, allow);  /* Allocate a register. */
	if (!irt_isphi(ir->t))
	  ra_weak(as, r);  /* But mark it as weakly referenced. */
	checkmclim(as);
	RA_DBGX((as, "snapreg   $f $r", ref, ir->r));
      } else {
	ra_spill(as, ir);  /* Otherwise force a spill slot. */
	RA_DBGX((as, "snapspill $f $s", ref, ir->s));
      }
    }
  }
}